

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form2_Normalize(NormalizeForm2 Normalize)

{
  value_type vVar1;
  uint8_t value;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  byte *pbVar6;
  const_reference pvVar7;
  reference pvVar8;
  code *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> normalized;
  Image output;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  uint32_t in_stack_ffffffffffffff2c;
  uint32_t in_stack_ffffffffffffff34;
  undefined1 isAnyValue;
  uint32_t in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff3c;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff40;
  Image *image;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 local_99 [25];
  undefined1 local_80 [24];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff98;
  ImageTemplate<unsigned_char> local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  code *local_8;
  
  local_8 = in_RDI;
  Unit_Test::intensityArray(in_stack_ffffffffffffff2c);
  Unit_Test::randomImage(in_stack_ffffffffffffff98);
  uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_48);
  uVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_48);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
             (uint8_t)(in_stack_ffffffffffffff34 >> 0x18),
             (uint8_t)(in_stack_ffffffffffffff34 >> 0x10));
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::fill
            ((ImageTemplate<unsigned_char> *)CONCAT44(uVar3,uVar4),value);
  (*local_8)(&local_48,local_80);
  image = (Image *)local_99;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1dd9c3);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)CONCAT44(uVar3,uVar4),
             CONCAT17(value,in_stack_ffffffffffffff48),(allocator_type *)image);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1dd9e3);
  pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,0);
  uVar5 = (uint)*pbVar6;
  pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,1);
  if (uVar5 == *pbVar6) {
LAB_001dda5b:
    isAnyValue = (undefined1)(in_stack_ffffffffffffff34 >> 0x18);
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,0);
    vVar1 = *pvVar7;
    pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_99 + 1),1);
    *pvVar8 = vVar1;
    pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_99 + 1),0);
    *pvVar8 = vVar1;
  }
  else {
    in_stack_ffffffffffffff38 = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_48);
    if (in_stack_ffffffffffffff38 == 1) {
      in_stack_ffffffffffffff34 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_48);
      if (in_stack_ffffffffffffff34 == 1) goto LAB_001dda5b;
    }
    isAnyValue = (undefined1)(in_stack_ffffffffffffff34 >> 0x18);
    pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_99 + 1),0);
    *pvVar8 = '\0';
    pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_99 + 1),1);
    *pvVar8 = 0xff;
  }
  bVar2 = Unit_Test::verifyImage
                    (image,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           CONCAT44(uVar5,in_stack_ffffffffffffff38),(bool)isAnyValue);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1ddb7f);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1ddb8c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image);
  return bVar2;
}

Assistant:

bool form2_Normalize(NormalizeForm2 Normalize)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const PenguinV_Image::Image input  = randomImage( intensity );
        PenguinV_Image::Image output( input.width(), input.height() );

        output.fill( intensityValue() );

        Normalize( input, output );

        std::vector < uint8_t > normalized( 2 );

        if( intensity[0] == intensity[1] || (input.width() == 1 && input.height() == 1) ) {
            normalized[0] = normalized[1] = intensity[0];
        }
        else {
            normalized[0] = 0;
            normalized[1] = 255;
        }

        return verifyImage( output, normalized );
    }